

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O3

void x11_send_init_error(X11Connection *xconn,char *err_message)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  undefined1 *ptr;
  undefined1 uVar5;
  undefined1 uVar6;
  
  __s = dupprintf("%s X11 proxy: %s\n","psusan",err_message);
  sVar4 = strlen(__s);
  iVar2 = (int)sVar4;
  ptr = (undefined1 *)safemalloc((long)(iVar2 + 0xd),1,0);
  uVar3 = iVar2 + 3;
  *ptr = 0;
  ptr[1] = (char)sVar4;
  *(undefined4 *)(ptr + 2) = *(undefined4 *)(xconn->firstpkt + 2);
  uVar5 = (undefined1)(uVar3 >> 2);
  uVar1 = (undefined1)(uVar3 >> 10);
  uVar6 = uVar5;
  if (xconn->firstpkt[0] != 'B') {
    uVar6 = uVar1;
    uVar1 = uVar5;
  }
  ptr[7] = uVar6;
  ptr[6] = uVar1;
  memset(ptr + 8,0,(long)(int)(uVar3 & 0xfffffffc));
  memcpy(ptr + 8,__s,(long)iVar2);
  (*xconn->c->vt->write)(xconn->c,false,ptr,(long)(int)((uVar3 & 0xfffffffc) + 8));
  (*xconn->c->vt->write_eof)(xconn->c);
  xconn->no_data_sent_to_x_client = false;
  safefree(ptr);
  safefree(__s);
  return;
}

Assistant:

static void x11_send_init_error(struct X11Connection *xconn,
                                const char *err_message)
{
    char *full_message;
    int msglen, msgsize;
    unsigned char *reply;

    full_message = dupprintf("%s X11 proxy: %s\n", appname, err_message);

    msglen = strlen(full_message);
    reply = snewn(8 + msglen+1 + 4, unsigned char); /* include zero */
    msgsize = (msglen + 3) & ~3;
    reply[0] = 0;              /* failure */
    reply[1] = msglen;         /* length of reason string */
    memcpy(reply + 2, xconn->firstpkt + 2, 4);  /* major/minor proto vsn */
    PUT_16BIT_X11(xconn->firstpkt[0], reply + 6, msgsize >> 2);/* data len */
    memset(reply + 8, 0, msgsize);
    memcpy(reply + 8, full_message, msglen);
    sshfwd_write(xconn->c, reply, 8 + msgsize);
    sshfwd_write_eof(xconn->c);
    xconn->no_data_sent_to_x_client = false;
    sfree(reply);
    sfree(full_message);
}